

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O3

void __thiscall libcellml::Analyser::AnalyserImpl::AnalyserImpl(AnalyserImpl *this)

{
  GeneratorProfilePtr *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  GeneratorProfile *pGVar3;
  string local_58;
  
  (this->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->mAnalyser = (Analyser *)0x0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  AnalyserModel::AnalyserModelImpl::create((AnalyserModelImpl *)&this->mModel,(ModelPtr *)&local_58)
  ;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
  }
  this_00 = &this->mGeneratorProfile;
  (this->mInternalEquations).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mInternalEquations).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mExternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mInternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInternalEquations).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GeneratorProfile::create((GeneratorProfile *)this_00,C);
  p_Var1 = &(this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar3 = (this->mGeneratorProfile).
           super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar2 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"abs","");
  GeneratorProfile::setAbsoluteValueString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ln","");
  GeneratorProfile::setNaturalLogarithmString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"log","");
  GeneratorProfile::setCommonLogarithmString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"rem","");
  GeneratorProfile::setRemString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arcsin","");
  GeneratorProfile::setAsinString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arccos","");
  GeneratorProfile::setAcosString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arctan","");
  GeneratorProfile::setAtanString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arcsec","");
  GeneratorProfile::setAsecString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arccsc","");
  GeneratorProfile::setAcscString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arccot","");
  GeneratorProfile::setAcotString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arcsinh","");
  GeneratorProfile::setAsinhString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arccosh","");
  GeneratorProfile::setAcoshString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arctanh","");
  GeneratorProfile::setAtanhString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arcsech","");
  GeneratorProfile::setAsechString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arccsch","");
  GeneratorProfile::setAcschString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"arccoth","");
  GeneratorProfile::setAcothString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"true","");
  GeneratorProfile::setTrueString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"false","");
  GeneratorProfile::setFalseString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"exponentiale","");
  GeneratorProfile::setEString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"pi","");
  GeneratorProfile::setPiString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"infinity","");
  GeneratorProfile::setInfString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  pGVar3 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_58._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"notanumber","");
  GeneratorProfile::setNanString(pGVar3,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Analyser::AnalyserImpl::AnalyserImpl()
{
    // Customise our generator's profile.

    mGeneratorProfile->setAbsoluteValueString("abs");
    mGeneratorProfile->setNaturalLogarithmString("ln");
    mGeneratorProfile->setCommonLogarithmString("log");
    mGeneratorProfile->setRemString("rem");
    mGeneratorProfile->setAsinString("arcsin");
    mGeneratorProfile->setAcosString("arccos");
    mGeneratorProfile->setAtanString("arctan");
    mGeneratorProfile->setAsecString("arcsec");
    mGeneratorProfile->setAcscString("arccsc");
    mGeneratorProfile->setAcotString("arccot");
    mGeneratorProfile->setAsinhString("arcsinh");
    mGeneratorProfile->setAcoshString("arccosh");
    mGeneratorProfile->setAtanhString("arctanh");
    mGeneratorProfile->setAsechString("arcsech");
    mGeneratorProfile->setAcschString("arccsch");
    mGeneratorProfile->setAcothString("arccoth");
    mGeneratorProfile->setTrueString("true");
    mGeneratorProfile->setFalseString("false");
    mGeneratorProfile->setEString("exponentiale");
    mGeneratorProfile->setPiString("pi");
    mGeneratorProfile->setInfString("infinity");
    mGeneratorProfile->setNanString("notanumber");
}